

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typevisitor.hh
# Opt level: O1

void __thiscall
Typelib::UnsupportedType::UnsupportedType(UnsupportedType *this,Type *type_,string *reason_)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  Typelib::Type::getName_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1181b5);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(reason_->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_70);
  *(undefined ***)&this->super_TypeException = &PTR__runtime_error_0011d978;
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  *(undefined ***)&this->super_TypeException = &PTR__UnsupportedType_0011d950;
  this->type = type_;
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  pcVar1 = (reason_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reason,pcVar1,pcVar1 + reason_->_M_string_length);
  return;
}

Assistant:

UnsupportedType(Type const& type_, std::string const& reason_)
            : TypeException("type " + type_.getName() + " not supported: " + reason_), type(type_), reason(reason_) {}